

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrsmem.c
# Opt level: O3

int smem_remove(char *filename)

{
  int iVar1;
  int iVar2;
  SHARED_P pvVar3;
  int h;
  int local_1c;
  
  if (filename == (char *)0x0) {
    iVar2 = 0x98;
  }
  else {
    iVar1 = __isoc99_sscanf(filename,"h%d",&local_1c);
    iVar2 = 0x97;
    if (iVar1 == 1) {
      iVar2 = shared_check_locked_index(local_1c);
      if (iVar2 == 0) {
        if (shared_lt[local_1c].lkcnt != -1) {
          iVar2 = shared_unlock(local_1c);
          if (iVar2 != 0) {
            return iVar2;
          }
          pvVar3 = shared_lock(local_1c,1);
          if (pvVar3 == (SHARED_P)0x0) {
            return 0x97;
          }
        }
      }
      else {
        iVar2 = smem_open(filename,1,&local_1c);
        if (iVar2 != 0) {
          return iVar2;
        }
      }
      shared_set_attr(local_1c,4);
      iVar2 = shared_unlock(local_1c);
      if (iVar2 == 0) {
        iVar2 = shared_free(local_1c);
      }
    }
  }
  return iVar2;
}

Assistant:

int     smem_remove(char *filename)
 { int nitems, h, r;

   if (NULL == filename) return(SHARED_NULPTR);
   nitems = sscanf(filename, "h%d", &h);
   if (1 != nitems) return(SHARED_BADARG);

   if (0 == shared_check_locked_index(h))       /* are we locked ? */

     { if (-1 != shared_lt[h].lkcnt)            /* are we locked RO ? */
         { if (SHARED_OK != (r = shared_unlock(h))) return(r);  /* yes, so relock in RW */
           if (NULL == shared_lock(h, SHARED_RDWRITE)) return(SHARED_BADARG);
         }

     }
   else                                         /* not locked */
     { if (SHARED_OK != (r = smem_open(filename, READWRITE, &h)))
         return(r);                             /* so open in RW mode */
     }

   shared_set_attr(h, SHARED_RESIZE);           /* delete PERSIST attribute */
   return(smem_close(h));                       /* detach segment (this will delete it) */
 }